

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger64
          (Parser *this,uint64 max_value,uint64 *output,char *error)

{
  TokenType TVar1;
  ErrorCollector *pEVar2;
  bool bVar3;
  allocator<char> local_41;
  long *local_40 [2];
  long local_30 [2];
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    bVar3 = io::Tokenizer::ParseInteger(&(this->input_->current_).text,max_value,output);
    if (!bVar3) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Integer out of range.","")
      ;
      pEVar2 = this->error_collector_;
      if (pEVar2 != (ErrorCollector *)0x0) {
        (*pEVar2->_vptr_ErrorCollector[2])
                  (pEVar2,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,local_40);
      }
      this->had_errors_ = true;
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
      *output = 0;
    }
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,error,&local_41);
    pEVar2 = this->error_collector_;
    if (pEVar2 != (ErrorCollector *)0x0) {
      (*pEVar2->_vptr_ErrorCollector[2])
                (pEVar2,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_40);
    }
    this->had_errors_ = true;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return TVar1 == TYPE_INTEGER;
}

Assistant:

bool Parser::ConsumeInteger64(uint64 max_value, uint64* output,
                              const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    if (!io::Tokenizer::ParseInteger(input_->current().text, max_value,
                                     output)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
      *output = 0;
    }
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}